

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CESkyCoord.cpp
# Opt level: O0

bool __thiscall test_CESkyCoord::test_copy(test_CESkyCoord *this)

{
  bool bVar1;
  byte bVar2;
  long *in_RDI;
  CESkyCoord obs;
  CESkyCoord gal;
  CESkyCoord icrs;
  CESkyCoord cirs;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  CESkyCoord *in_stack_fffffffffffffd30;
  CESkyCoord *pCVar3;
  CESkyCoord *in_stack_fffffffffffffd48;
  CESkyCoord *other;
  CESkyCoord *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  CESkyCoord *in_stack_fffffffffffffd90;
  allocator *paVar4;
  undefined4 local_240;
  undefined1 local_239 [33];
  undefined4 local_218;
  allocator local_211;
  string local_210 [32];
  undefined1 local_1f0 [48];
  undefined4 local_1c0;
  undefined1 local_1b9 [33];
  undefined1 local_198 [48];
  undefined4 local_168;
  allocator local_161;
  string local_160 [32];
  undefined1 local_140 [48];
  undefined4 local_110;
  allocator local_109;
  string local_108 [32];
  undefined1 local_e8 [48];
  undefined4 local_b8;
  allocator local_b1;
  string local_b0 [32];
  undefined4 local_90;
  allocator local_89;
  string local_88 [32];
  undefined4 local_68;
  allocator local_61;
  string local_60 [32];
  undefined4 local_40 [5];
  allocator local_29;
  string local_28 [40];
  
  bVar1 = operator==(in_stack_fffffffffffffd90,
                     (CESkyCoord *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"test_copy",&local_29);
  local_40[0] = 0x97;
  (**(code **)(*in_RDI + 0x68))(in_RDI,bVar1,1,local_28,local_40);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  bVar1 = operator!=(in_stack_fffffffffffffd30,
                     (CESkyCoord *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"test_copy",&local_61);
  local_68 = 0x98;
  (**(code **)(*in_RDI + 0x68))(in_RDI,bVar1,0,local_60,&local_68);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar2 = operator==(in_stack_fffffffffffffd90,
                     (CESkyCoord *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  paVar4 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"test_copy",paVar4);
  local_90 = 0x99;
  (**(code **)(*in_RDI + 0x68))(in_RDI,bVar2 & 1,0,local_88,&local_90);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  bVar1 = operator!=(in_stack_fffffffffffffd30,
                     (CESkyCoord *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"test_copy",&local_b1);
  local_b8 = 0x9a;
  (**(code **)(*in_RDI + 0x68))(in_RDI,bVar1,1,local_b0,&local_b8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  CESkyCoord::CESkyCoord(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"test_copy",&local_109);
  local_110 = 0x9e;
  (**(code **)(*in_RDI + 200))(in_RDI,local_e8,in_RDI + 0x44,local_108,&local_110);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  CESkyCoord::CESkyCoord(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"test_copy",&local_161);
  local_168 = 0xa2;
  (**(code **)(*in_RDI + 200))(in_RDI,local_140,in_RDI + 0x4a,local_160,&local_168);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  CESkyCoord::CESkyCoord(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  other = (CESkyCoord *)(in_RDI + 0x50);
  pCVar3 = (CESkyCoord *)local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1b9 + 1),"test_copy",(allocator *)pCVar3);
  local_1c0 = 0xa6;
  (**(code **)(*in_RDI + 200))(in_RDI,local_198,other,local_1b9 + 1,&local_1c0);
  std::__cxx11::string::~string((string *)(local_1b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b9);
  CESkyCoord::CESkyCoord(pCVar3,other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"test_copy",&local_211);
  local_218 = 0xaa;
  (**(code **)(*in_RDI + 200))(in_RDI,local_1f0,in_RDI + 0x56,local_210,&local_218);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  CESkyCoord::SetCoordinates
            (in_stack_fffffffffffffd30,
             (CESkyCoord *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  pCVar3 = (CESkyCoord *)local_239;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_239 + 1),"test_copy",(allocator *)pCVar3);
  local_240 = 0xae;
  (**(code **)(*in_RDI + 200))(in_RDI,local_198,local_140,local_239 + 1,&local_240);
  std::__cxx11::string::~string((string *)(local_239 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_239);
  bVar2 = (**(code **)(*in_RDI + 0x18))();
  CESkyCoord::~CESkyCoord(pCVar3);
  CESkyCoord::~CESkyCoord(pCVar3);
  CESkyCoord::~CESkyCoord(pCVar3);
  CESkyCoord::~CESkyCoord(pCVar3);
  return (bool)(bVar2 & 1);
}

Assistant:

bool test_CESkyCoord::test_copy()
{
    // Make sure the equals and not-equals operators work properly
    test_bool((base_icrs_ == base_icrs_), true, __func__, __LINE__);
    test_bool((base_icrs_ != base_icrs_), false, __func__, __LINE__);
    test_bool((base_icrs_ == base_gal_), false, __func__, __LINE__);
    test_bool((base_icrs_ != base_gal_), true, __func__, __LINE__);

    // Copy CIRS
    CESkyCoord cirs = base_cirs_;
    test_coords(cirs, base_cirs_, __func__, __LINE__);

    // Copy ICRS
    CESkyCoord icrs = base_icrs_;
    test_coords(icrs, base_icrs_, __func__, __LINE__);

    // Copy Galactic
    CESkyCoord gal = base_gal_;
    test_coords(gal, base_gal_, __func__, __LINE__);

    // Copy Observed
    CESkyCoord obs = base_obs_;
    test_coords(obs, base_obs_, __func__, __LINE__);

    // Copy coordinates directly
    gal.SetCoordinates(icrs);
    test_coords(gal, icrs, __func__, __LINE__);

    return pass();
}